

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_range_cardinality
                   (roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  run_container_t *prVar9;
  ushort x;
  long lVar10;
  uint64_t uVar11;
  ushort uVar12;
  ulong uVar13;
  
  uVar6 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar6 = range_end;
  }
  if (uVar6 <= range_start) {
    return 0;
  }
  lVar10 = uVar6 - 1;
  iVar7 = (r->high_low_container).size;
  uVar6 = (ulong)iVar7;
  uVar12 = (ushort)(range_start >> 0x10);
  x = (ushort)lVar10;
  if ((uVar6 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[uVar6 - 1] == uVar12)) {
    uVar8 = iVar7 - 1;
LAB_00107b48:
    if (-1 < (int)uVar8) {
LAB_00107b50:
      prVar9 = (run_container_t *)(r->high_low_container).containers[uVar8];
      uVar3 = (r->high_low_container).typecodes[uVar8];
      if (uVar12 == (ushort)((ulong)lVar10 >> 0x10)) {
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar9,x);
        }
        else if (uVar3 == '\x02') {
          if (prVar9->n_runs < 1) {
            iVar7 = 0;
          }
          else {
            iVar7 = prVar9->n_runs + -1;
            iVar5 = 0;
            do {
              uVar4 = (uint)(iVar7 + iVar5) >> 1;
              uVar12 = *(ushort *)((long)&prVar9->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe))
              ;
              if (uVar12 < x) {
                iVar5 = uVar4 + 1;
              }
              else {
                if (uVar12 <= x) {
                  iVar7 = uVar4 + 1;
                  goto LAB_00107c4e;
                }
                iVar7 = uVar4 - 1;
              }
            } while (iVar5 <= iVar7);
            iVar7 = -iVar5;
            if (0 < iVar5) {
              iVar7 = iVar5;
            }
          }
        }
        else {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar9,x);
        }
      }
      else {
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_cardinality(prVar9);
        }
        else {
          iVar7 = prVar9->n_runs;
        }
      }
LAB_00107c4e:
      uVar11 = (uint64_t)iVar7;
      if ((short)range_start != 0) {
        prVar9 = (run_container_t *)(r->high_low_container).containers[uVar8];
        uVar3 = (r->high_low_container).typecodes[uVar8];
        uVar12 = (short)range_start - 1;
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar9,uVar12);
        }
        else if (uVar3 == '\x02') {
          if (prVar9->n_runs < 1) {
            iVar7 = 0;
          }
          else {
            iVar7 = prVar9->n_runs + -1;
            iVar5 = 0;
            do {
              uVar4 = (uint)(iVar7 + iVar5) >> 1;
              uVar1 = *(ushort *)((long)&prVar9->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe));
              if (uVar1 < uVar12) {
                iVar5 = uVar4 + 1;
              }
              else {
                if (uVar1 <= uVar12) {
                  iVar7 = uVar4 + 1;
                  goto LAB_00107cde;
                }
                iVar7 = uVar4 - 1;
              }
            } while (iVar5 <= iVar7);
            iVar7 = -iVar5;
            if (0 < iVar5) {
              iVar7 = iVar5;
            }
          }
        }
        else {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar9,uVar12);
        }
LAB_00107cde:
        uVar11 = uVar11 - (long)iVar7;
      }
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)(uint)(r->high_low_container).size;
      goto LAB_00107ce7;
    }
  }
  else {
    if (0 < iVar7) {
      iVar7 = iVar7 + -1;
      uVar4 = 0;
      do {
        uVar8 = iVar7 + uVar4 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar4 & 0xfffffffe));
        if (uVar1 < uVar12) {
          uVar4 = uVar8 + 1;
        }
        else {
          if (uVar1 <= uVar12) goto LAB_00107b50;
          iVar7 = uVar8 - 1;
        }
      } while ((int)uVar4 <= iVar7);
      uVar8 = ~uVar4;
      goto LAB_00107b48;
    }
    uVar8 = 0xffffffff;
  }
  uVar8 = ~uVar8;
  uVar11 = 0;
LAB_00107ce7:
  if ((int)uVar8 < (int)uVar6) {
    uVar4 = (uint)((ulong)lVar10 >> 0x10) & 0xffff;
    uVar13 = (ulong)uVar8;
    do {
      uVar8 = (uint)(r->high_low_container).keys[uVar13];
      if (uVar4 <= uVar8) {
        if (uVar4 != uVar8) {
          return uVar11;
        }
        prVar9 = (run_container_t *)(r->high_low_container).containers[uVar13];
        uVar3 = (r->high_low_container).typecodes[uVar13];
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar9,x);
          goto LAB_00107dc1;
        }
        if (uVar3 != '\x02') {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar9,x);
          goto LAB_00107dc1;
        }
        if (0 < prVar9->n_runs) {
          iVar7 = prVar9->n_runs + -1;
          iVar5 = 0;
          goto LAB_00107d7b;
        }
        iVar7 = 0;
        goto LAB_00107dc1;
      }
      prVar9 = (run_container_t *)(r->high_low_container).containers[uVar13];
      uVar3 = (r->high_low_container).typecodes[uVar13];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&prVar9->runs;
        prVar9 = *(run_container_t **)prVar9;
      }
      if (uVar3 == '\x03') {
        iVar7 = run_container_cardinality(prVar9);
        uVar6 = (ulong)(uint)(r->high_low_container).size;
      }
      else {
        iVar7 = prVar9->n_runs;
      }
      uVar11 = uVar11 + (long)iVar7;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < (int)uVar6);
  }
  return uVar11;
LAB_00107d7b:
  do {
    uVar8 = (uint)(iVar7 + iVar5) >> 1;
    uVar12 = *(ushort *)((long)&prVar9->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe));
    if (uVar12 < x) {
      iVar5 = uVar8 + 1;
    }
    else {
      if (uVar12 <= x) {
        iVar7 = uVar8 + 1;
        goto LAB_00107dc1;
      }
      iVar7 = uVar8 - 1;
    }
  } while (iVar5 <= iVar7);
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
LAB_00107dc1:
  return uVar11 + (long)iVar7;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality(const roaring_bitmap_t *r,
                                          uint64_t range_start,
                                          uint64_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_end > UINT32_MAX) {
        range_end = UINT32_MAX + UINT64_C(1);
    }
    if (range_start >= range_end) {
        return 0;
    }
    range_end--;  // make range_end inclusive
    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}